

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void google::protobuf::CheckFieldIndex(FieldDescriptor *field,int index)

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (field != (FieldDescriptor *)0x0) {
    if (index == -1 && *(int *)(field + 0x30) == 3) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x81);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_48,"Index must be in range of repeated field values. ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,"Field: ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)field);
      internal::LogFinisher::operator=(&local_49,pLVar1);
    }
    else {
      if (*(int *)(field + 0x30) == 3 || index == -1) {
        return;
      }
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x84);
      pLVar1 = internal::LogMessage::operator<<(&local_48,"Index must be -1 for singular fields.");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,"Field: ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)field);
      internal::LogFinisher::operator=(&local_49,pLVar1);
    }
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void CheckFieldIndex(const FieldDescriptor* field, int index) {
  if (field == NULL) { return; }

  if (field->is_repeated() && index == -1) {
    GOOGLE_LOG(DFATAL) << "Index must be in range of repeated field values. "
                << "Field: " << field->name();
  } else if (!field->is_repeated() && index != -1) {
    GOOGLE_LOG(DFATAL) << "Index must be -1 for singular fields."
                << "Field: " << field->name();
  }
}